

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O0

CK_RV SymDecryptUpdate(Session *session,CK_BYTE_PTR pEncryptedData,CK_ULONG ulEncryptedDataLen,
                      CK_BYTE_PTR pData,CK_ULONG_PTR pDataLen)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t sVar5;
  size_t sVar6;
  uchar *__src;
  void *in_RCX;
  long in_RDX;
  Session *in_RDI;
  ulong *in_R8;
  ByteString decryptedData;
  ByteString data;
  int nrOfBlocks;
  size_t paddingAdjustByte;
  CK_ULONG maxSize;
  size_t remainingSize;
  size_t blockSize;
  SymmetricAlgorithm *cipher;
  ByteString *this;
  Session *in_stack_fffffffffffffe90;
  Session *this_00;
  long lVar7;
  size_t in_stack_fffffffffffffea0;
  ulong uVar8;
  uchar *in_stack_fffffffffffffea8;
  ByteString *in_stack_fffffffffffffeb0;
  undefined1 local_b8 [40];
  undefined1 local_90 [44];
  int local_64;
  long local_60;
  ulong local_58;
  long local_50;
  Session *local_48;
  SymmetricAlgorithm *local_40;
  ulong *local_38;
  void *local_30;
  long local_28;
  Session *local_18;
  CK_RV local_10;
  
  local_38 = in_R8;
  local_30 = in_RCX;
  local_28 = in_RDX;
  local_18 = in_RDI;
  local_40 = Session::getSymmetricCryptoOp(in_RDI);
  if ((local_40 == (SymmetricAlgorithm *)0x0) ||
     (bVar2 = Session::getAllowMultiPartOp(local_18), !bVar2)) {
    Session::resetOp(in_stack_fffffffffffffe90);
    local_10 = 0x91;
  }
  else {
    iVar3 = (*local_40->_vptr_SymmetricAlgorithm[0xd])();
    local_48 = (Session *)CONCAT44(extraout_var,iVar3);
    iVar3 = (*local_40->_vptr_SymmetricAlgorithm[0x10])();
    local_50 = CONCAT44(extraout_var_00,iVar3);
    local_58 = local_28 + local_50;
    uVar4 = (*local_40->_vptr_SymmetricAlgorithm[0x13])();
    if ((uVar4 & 1) != 0) {
      uVar4 = (*local_40->_vptr_SymmetricAlgorithm[0xf])();
      local_60 = (long)(int)(uint)((uVar4 & 1) != 0);
      local_64 = (int)((ulong)((local_28 + local_50) - local_60) / (ulong)local_48);
      local_58 = (long)local_64 * (long)local_48;
    }
    uVar4 = (*local_40->_vptr_SymmetricAlgorithm[0x14])(local_40,local_28);
    if ((uVar4 & 1) == 0) {
      Session::resetOp(in_stack_fffffffffffffe90);
      local_10 = 0x41;
    }
    else if (local_30 == (void *)0x0) {
      *local_38 = local_58;
      local_10 = 0;
    }
    else if (*local_38 < local_58) {
      softHSMLog(7,"SymDecryptUpdate",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                 ,0xd8d,
                 "Output buffer too short   ulEncryptedDataLen: %#5x  output buffer size: %#5x  blockSize: %#3x  remainingSize: %#4x  maxSize: %#5x"
                 ,local_28,*local_38,local_48,local_50,local_58);
      *local_38 = local_58;
      local_10 = 0x150;
    }
    else {
      ByteString::ByteString
                (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
      ByteString::ByteString((ByteString *)0x16c0cd);
      uVar4 = (*local_40->_vptr_SymmetricAlgorithm[6])(local_40,local_90,local_b8);
      this_00 = local_48;
      lVar7 = local_50;
      uVar8 = local_58;
      if ((uVar4 & 1) == 0) {
        Session::resetOp(in_stack_fffffffffffffe90);
        local_10 = 0x40;
      }
      else {
        this = (ByteString *)*local_38;
        sVar5 = ByteString::size((ByteString *)0x16c1cd);
        softHSMLog(7,"SymDecryptUpdate",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                   ,0xd9d,
                   "ulEncryptedDataLen: %#5x  output buffer size: %#5x  blockSize: %#3x  remainingSize: %#4x  maxSize: %#5x  decryptedData.size(): %#5x"
                   ,local_28,this,this_00,lVar7,uVar8,sVar5);
        uVar1 = *local_38;
        sVar6 = ByteString::size((ByteString *)0x16c25f);
        if (uVar1 < sVar6) {
          Session::resetOp(this_00);
          uVar1 = *local_38;
          sVar6 = ByteString::size((ByteString *)0x16c2a5);
          softHSMLog(3,"SymDecryptUpdate",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                     ,0xda4,
                     "DecryptUpdate returning too much data. Length of output data buffer is %i but %i bytes was returned by the decrypt."
                     ,uVar1,sVar6,this_00,lVar7,uVar8,sVar5);
          local_10 = 0x41;
        }
        else {
          sVar5 = ByteString::size((ByteString *)0x16c30d);
          if (sVar5 != 0) {
            __src = ByteString::byte_str(this);
            sVar5 = ByteString::size((ByteString *)0x16c34d);
            memcpy(local_30,__src,sVar5);
          }
          sVar5 = ByteString::size((ByteString *)0x16c375);
          *local_38 = sVar5;
          local_10 = 0;
        }
      }
      ByteString::~ByteString((ByteString *)0x16c3b0);
      ByteString::~ByteString((ByteString *)0x16c3bd);
    }
  }
  return local_10;
}

Assistant:

static CK_RV SymDecryptUpdate(Session* session, CK_BYTE_PTR pEncryptedData, CK_ULONG ulEncryptedDataLen, CK_BYTE_PTR pData, CK_ULONG_PTR pDataLen)
{
	SymmetricAlgorithm* cipher = session->getSymmetricCryptoOp();
	if (cipher == NULL || !session->getAllowMultiPartOp())
	{
		session->resetOp();
		return CKR_OPERATION_NOT_INITIALIZED;
	}

	// Check encrypted data size
	size_t blockSize = cipher->getBlockSize();
	size_t remainingSize = cipher->getBufferSize();
	CK_ULONG maxSize = ulEncryptedDataLen + remainingSize;
	if (cipher->isBlockCipher())
	{
		// There must always be one block left in padding mode if next operation is DecryptFinal.
		// To guarantee that one byte is removed in padding mode when the number of blocks is calculated.
		size_t paddingAdjustByte = cipher->getPaddingMode() ? 1 : 0;
		int nrOfBlocks = (ulEncryptedDataLen + remainingSize - paddingAdjustByte) / blockSize;
		maxSize = nrOfBlocks * blockSize;
	}
	if (!cipher->checkMaximumBytes(ulEncryptedDataLen))
	{
		session->resetOp();
		return CKR_ENCRYPTED_DATA_LEN_RANGE;
	}

	// Give required output buffer size.
	if (pData == NULL_PTR)
	{
		*pDataLen = maxSize;
		return CKR_OK;
	}

	// Check output buffer size
	if (*pDataLen < maxSize)
	{
		DEBUG_MSG("Output buffer too short   ulEncryptedDataLen: %#5x  output buffer size: %#5x  blockSize: %#3x  remainingSize: %#4x  maxSize: %#5x",
			  ulEncryptedDataLen, *pDataLen, blockSize, remainingSize, maxSize);
		*pDataLen = maxSize;
		return CKR_BUFFER_TOO_SMALL;
	}

	// Get the data
	ByteString data(pEncryptedData, ulEncryptedDataLen);
	ByteString decryptedData;

	// Decrypt the data
	if (!cipher->decryptUpdate(data, decryptedData))
	{
		session->resetOp();
		return CKR_ENCRYPTED_DATA_INVALID;
	}
	DEBUG_MSG("ulEncryptedDataLen: %#5x  output buffer size: %#5x  blockSize: %#3x  remainingSize: %#4x  maxSize: %#5x  decryptedData.size(): %#5x",
		  ulEncryptedDataLen, *pDataLen, blockSize, remainingSize, maxSize, decryptedData.size());

	// Check output size from crypto. Unrecoverable error if too large.
	if (*pDataLen < decryptedData.size())
	{
		session->resetOp();
		ERROR_MSG("DecryptUpdate returning too much data. Length of output data buffer is %i but %i bytes was returned by the decrypt.",
				*pDataLen, decryptedData.size());
		return CKR_ENCRYPTED_DATA_LEN_RANGE;
	}

	if (decryptedData.size() > 0)
	{
		memcpy(pData, decryptedData.byte_str(), decryptedData.size());
	}
	*pDataLen = decryptedData.size();

	return CKR_OK;
}